

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O3

void * value_data(value v)

{
  return v;
}

Assistant:

void *value_data(value v)
{
	if (v == NULL)
	{
		return NULL;
	}

	/* Right now the memory layout is designed in a way that
	* the first byte of the value is the data itself, so returning
	* the value as (void *) has the same effect as accessing the data
	*/
	return v;
}